

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

SN_ELEMENT * __thiscall ON_SN_BLOCK::BinarySearchBlockHelper(ON_SN_BLOCK *this,ON__UINT64 sn)

{
  ulong uVar1;
  ulong uVar2;
  SN_ELEMENT *pSVar3;
  
  pSVar3 = this->m_sn;
  uVar2 = (ulong)this->m_count;
  while( true ) {
    do {
      uVar1 = uVar2;
      if (uVar1 == 0) {
        return (SN_ELEMENT *)0x0;
      }
      uVar2 = uVar1 >> 1;
    } while (sn < pSVar3[uVar2].m_sn);
    if (sn <= pSVar3[uVar2].m_sn) break;
    pSVar3 = pSVar3 + uVar2 + 1;
    uVar2 = uVar1 - (uVar2 + 1);
  }
  return pSVar3 + uVar2;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SN_BLOCK::BinarySearchBlockHelper(ON__UINT64 sn)
{
  // Perform a binary search on the serial number values in the m_sn[] array.
  //
  // This is a high speed helper function.  
  //
  // The calling function verify:
  //   m_sn[] is sorted by serial number (1 == m_sorted)
  //   m_count > 0
  //   m_sn0 <= sn <= m_sn1.

  ON__UINT64 i, j;
  struct ON_SerialNumberMap::SN_ELEMENT* e;
  ON__UINT64 midsn;

  i = m_count;
  e = m_sn;
  while (i > 0 )
  {
    midsn = e[(j=i/2)].m_sn;
    if ( sn < midsn )
    {
      i = j;
    }
    else if ( sn > midsn )
    {
      j++;
      e += j;
      i -= j;
    }
    else 
    {
      return e + j;
    }
  }
  return 0;
}